

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  int iVar1;
  expdesc *e_local;
  FuncState *fs_local;
  
  luaK_exp2val(fs,e);
  switch(e->k) {
  case VNIL:
    iVar1 = nilK(fs);
    (e->u).info = iVar1;
    break;
  case VTRUE:
    iVar1 = boolK(fs,1);
    (e->u).info = iVar1;
    break;
  case VFALSE:
    iVar1 = boolK(fs,0);
    (e->u).info = iVar1;
    break;
  case VK:
    break;
  case VKFLT:
    iVar1 = luaK_numberK(fs,(e->u).nval);
    (e->u).info = iVar1;
    break;
  case VKINT:
    iVar1 = luaK_intK(fs,(e->u).ival);
    (e->u).info = iVar1;
    break;
  default:
    goto switchD_001837f6_default;
  }
  e->k = VK;
  if ((e->u).info < 0x80) {
    fs_local._4_4_ = (e->u).info | 0x80;
  }
  else {
switchD_001837f6_default:
    fs_local._4_4_ = luaK_exp2anyreg(fs,e);
  }
  return fs_local._4_4_;
}

Assistant:

int luaK_exp2RK (FuncState *fs, expdesc *e) {
  luaK_exp2val(fs, e);
  switch (e->k) {  /* move constants to 'k' */
    case VTRUE: e->u.info = boolK(fs, 1); goto vk;
    case VFALSE: e->u.info = boolK(fs, 0); goto vk;
    case VNIL: e->u.info = nilK(fs); goto vk;
    case VKINT: e->u.info = luaK_intK(fs, e->u.ival); goto vk;
    case VKFLT: e->u.info = luaK_numberK(fs, e->u.nval); goto vk;
    case VK:
     vk:
      e->k = VK;
      if (e->u.info <= MAXINDEXRK)  /* constant fits in 'argC'? */
        return RKASK(e->u.info);
      else break;
    default: break;
  }
  /* not a constant in the right range: put it in a register */
  return luaK_exp2anyreg(fs, e);
}